

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator iVar1;
  int i;
  int iVar2;
  pointer ppVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  TypeParam ht;
  pair<const_char_*const,_ValueType> local_140;
  Hasher local_130;
  SetKey local_122;
  SelectKey local_121;
  pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_120;
  undefined **local_d0;
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_c8;
  
  local_140.first = (char *)0x0;
  local_140.second.s_._0_4_ = 0;
  local_130.id_ = 0;
  local_130.num_hashes_ = 0;
  local_130.num_compares_ = 0;
  local_120.first.ht._0_4_ = 0;
  local_120.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c18d38;
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_c8,10000,(Hasher *)&local_140,&local_130,&local_121,&local_122,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)&local_120);
  local_d0 = &PTR__BaseHashtableInterface_00c18cb8;
  fVar4 = 0.4;
  if (local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      shrink_factor_ <= 0.4) {
    fVar4 = local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
            shrink_factor_;
  }
  local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_factor_ = 0.8;
  fVar5 = fVar4 * (float)local_c8.table.settings.table_size;
  fVar6 = (float)local_c8.table.settings.table_size * 0.8;
  local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (size_type)fVar6;
  local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ =
       (long)(fVar6 - 9.223372e+18) &
       (long)local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
             enlarge_threshold_ >> 0x3f |
       local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
       enlarge_threshold_;
  local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (size_type)fVar5;
  local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ =
       (long)(fVar5 - 9.223372e+18) &
       (long)local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
             shrink_threshold_ >> 0x3f |
       local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
       shrink_threshold_;
  local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  iVar2 = 1;
  local_c8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_factor_ = fVar4;
  do {
    UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)&local_140);
    google::
    sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_c8,1);
    google::
    sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_120,&local_c8,&local_140);
    if ((char *)CONCAT44(local_140.second.s_._4_4_,local_140.second.s_._0_4_) != "hi") {
      free((char *)CONCAT44(local_140.second.s_._4_4_,local_140.second.s_._0_4_));
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 100);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&local_c8,0);
  local_140.first = (char *)local_c8.table.settings.table_size;
  local_130.id_ = 300;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((internal *)&local_120,"ht.bucket_count()","300u",(unsigned_long *)&local_140,
             (uint *)&local_130);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_140);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xaf1463;
    }
    else {
      ppVar3 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x29f,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((long *)local_140.first != (long *)0x0) {
      (**(code **)(*(long *)local_140.first + 8))();
    }
  }
  iVar1._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_120.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_120.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&local_c8,9000);
  local_130.id_ = 0x4000;
  local_140.first = (char *)local_c8.table.settings.table_size;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_120,"16384u","ht.bucket_count()",(uint *)&local_130,
             (unsigned_long *)&local_140);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_140);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xaf1463;
    }
    else {
      ppVar3 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2a3,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((long *)local_140.first != (long *)0x0) {
      (**(code **)(*(long *)local_140.first + 8))();
    }
  }
  iVar1._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_120.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_120.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  iVar2 = 0x65;
  do {
    UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)&local_140);
    google::
    sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_c8,1);
    google::
    sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_120,&local_c8,&local_140);
    if ((char *)CONCAT44(local_140.second.s_._4_4_,local_140.second.s_._0_4_) != "hi") {
      free((char *)CONCAT44(local_140.second.s_._4_4_,local_140.second.s_._0_4_));
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 200);
  local_140.first = (char *)local_c8.table.settings.table_size;
  local_130.id_ = 0x4000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_120,"ht.bucket_count()","16384u",(unsigned_long *)&local_140,
             (uint *)&local_130);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_140);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xaf1463;
    }
    else {
      ppVar3 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2a6,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((long *)local_140.first != (long *)0x0) {
      (**(code **)(*(long *)local_140.first + 8))();
    }
  }
  iVar1._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_120.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_120.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_d0 = &PTR__BaseHashtableInterface_00c18d38;
  std::
  vector<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_c8.table.groups);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeAndRehash) {
  // resize() and rehash() are synonyms.  rehash() is the tr1 name.
  TypeParam ht(10000);
  ht.max_load_factor(0.8f);  // for consistency's sake

  for (int i = 1; i < 100; ++i) ht.insert(this->UniqueObject(i));
  ht.resize(0);
  // Now ht should be as small as possible.
  EXPECT_LT(ht.bucket_count(), 300u);

  ht.rehash(9000);  // use the 'rehash' version of the name.
  // Bucket count should be next power of 2, after considering max_load_factor.
  EXPECT_EQ(16384u, ht.bucket_count());
  for (int i = 101; i < 200; ++i) ht.insert(this->UniqueObject(i));
  // Adding a few hundred buckets shouldn't have caused a resize yet.
  EXPECT_EQ(ht.bucket_count(), 16384u);
}